

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

bool __thiscall senjo::UCIAdapter::QuitCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  Output local_20;
  
  sVar1 = DAT_001b6788;
  if (params != (char *)0x0 && DAT_001b6788 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
    if (iVar2 == 0) {
      if (params[sVar1] == '\0') {
        bVar3 = true;
      }
      else {
        iVar2 = isspace((int)params[sVar1]);
        bVar3 = iVar2 != 0;
      }
      goto LAB_00136a24;
    }
  }
  bVar3 = false;
LAB_00136a24:
  if (bVar3 == false) {
    (*this->engine->_vptr_ChessEngine[0x1b])();
    Thread::Join(&this->thread);
  }
  else {
    Output::Output(&local_20,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Quit_abi_cxx11_,DAT_001b68c8);
    Output::~Output(&local_20);
    Output::Output(&local_20,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stop engine and terminate program.",0x22);
    Output::~Output(&local_20);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool UCIAdapter::QuitCommand(const char *params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Quit;
    Output() << "Stop engine and terminate program.";
    return false;
  }
  engine->Quit();
  thread.Join();
  return true;
}